

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMan.c
# Opt level: O2

Cut_Man_t * Cut_ManStart(Cut_Params_t *pParams)

{
  int iVar1;
  int iVar2;
  Cut_Man_t *pCVar3;
  Vec_Ptr_t *pVVar4;
  uint *puVar5;
  Vec_Int_t *pVVar6;
  Extra_MmFixed_t *pEVar7;
  void *Entry;
  void *Entry_00;
  void *Entry_01;
  int nEntrySize;
  uint uVar8;
  
  if (9 < pParams->nVarsMax - 3U) {
    __assert_fail("pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutMan.c"
                  ,0x34,"Cut_Man_t *Cut_ManStart(Cut_Params_t *)");
  }
  pCVar3 = (Cut_Man_t *)calloc(1,0x140);
  pCVar3->pParams = pParams;
  pVVar4 = Vec_PtrAlloc(pParams->nIdsMax);
  pCVar3->vCutsNew = pVVar4;
  Vec_PtrFill(pVVar4,pParams->nIdsMax,Entry);
  if (pParams->fSeq == 0) {
LAB_003a320d:
    iVar2 = pParams->nVarsMax;
    iVar1 = pParams->fTruth;
    nEntrySize = iVar2 * 4 + 0x18;
    pCVar3->EntrySize = nEntrySize;
    if (iVar1 == 0) goto LAB_003a32a5;
    if (iVar2 < 0xf) goto LAB_003a3245;
    pParams->fTruth = 0;
    uVar8 = 0;
    printf("Skipping computation of truth table for more than %d inputs.\n");
  }
  else {
    pParams->fFilter = 1;
    pVVar4 = Vec_PtrAlloc(pParams->nIdsMax);
    pCVar3->vCutsOld = pVVar4;
    Vec_PtrFill(pVVar4,pParams->nIdsMax,Entry_00);
    pVVar4 = Vec_PtrAlloc(pParams->nCutSet);
    pCVar3->vCutsTemp = pVVar4;
    Vec_PtrFill(pVVar4,pParams->nCutSet,Entry_01);
    if (pParams->fTruth == 0) goto LAB_003a320d;
    iVar2 = pParams->nVarsMax;
    if (5 < iVar2) {
      pParams->fTruth = 0;
      puts("Skipping computation of truth tables for sequential cuts with more than 5 inputs.");
      goto LAB_003a320d;
    }
LAB_003a3245:
    uVar8 = 1 << ((char)iVar2 - 5U & 0x1f);
    if (iVar2 < 6) {
      uVar8 = 1;
    }
    pCVar3->nTruthWords = uVar8;
    nEntrySize = (iVar2 + uVar8) * 4 + 0x18;
    pCVar3->EntrySize = nEntrySize;
  }
  puVar5 = (uint *)malloc((ulong)(uVar8 * 4) << 2);
  pCVar3->puTemp[0] = puVar5;
  puVar5 = puVar5 + uVar8;
  pCVar3->puTemp[1] = puVar5;
  pCVar3->puTemp[2] = puVar5 + uVar8;
  pCVar3->puTemp[3] = puVar5 + uVar8 + uVar8;
LAB_003a32a5:
  if (pParams->fRecord != 0) {
    pVVar6 = Vec_IntStart(pParams->nIdsMax);
    pCVar3->vNodeCuts = pVVar6;
    pVVar6 = Vec_IntStart(pParams->nIdsMax);
    pCVar3->vNodeStarts = pVVar6;
    pVVar6 = Vec_IntAlloc(0);
    pCVar3->vCutPairs = pVVar6;
  }
  if ((pParams->fMap != 0) && (pParams->fSeq == 0)) {
    pVVar6 = Vec_IntStart(pParams->nIdsMax);
    pCVar3->vDelays = pVVar6;
    pVVar6 = Vec_IntStart(pParams->nIdsMax);
    pCVar3->vDelays2 = pVVar6;
    iVar2 = pParams->nIdsMax;
    pVVar4 = Vec_PtrAlloc(iVar2);
    pVVar4->nSize = iVar2;
    memset(pVVar4->pArray,0,(long)iVar2 << 3);
    pCVar3->vCutsMax = pVVar4;
  }
  pEVar7 = Extra_MmFixedStart(nEntrySize);
  pCVar3->pMmCuts = pEVar7;
  pVVar4 = Vec_PtrAlloc(100);
  pCVar3->vTemp = pVVar4;
  return pCVar3;
}

Assistant:

Cut_Man_t * Cut_ManStart( Cut_Params_t * pParams )
{
    Cut_Man_t * p;
//    extern int nTruthDsd;
//    nTruthDsd = 0;
    assert( pParams->nVarsMax >= 3 && pParams->nVarsMax <= CUT_SIZE_MAX );
    p = ABC_ALLOC( Cut_Man_t, 1 );
    memset( p, 0, sizeof(Cut_Man_t) );
    // set and correct parameters
    p->pParams = pParams;
    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, pParams->nIdsMax, NULL );
    // prepare storage for sequential cuts
    if ( pParams->fSeq )
    {
        p->pParams->fFilter = 1;
        p->vCutsOld = Vec_PtrAlloc( pParams->nIdsMax );
        Vec_PtrFill( p->vCutsOld, pParams->nIdsMax, NULL );
        p->vCutsTemp = Vec_PtrAlloc( pParams->nCutSet );
        Vec_PtrFill( p->vCutsTemp, pParams->nCutSet, NULL );
        if ( pParams->fTruth && pParams->nVarsMax > 5 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth tables for sequential cuts with more than 5 inputs.\n" );
        }
    }
    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + pParams->nVarsMax * sizeof(int);
    if ( pParams->fTruth )
    {
        if ( pParams->nVarsMax > 14 )
        {
            pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than %d inputs.\n", 14 );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
        p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
        p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
        p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
        p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    }
    // enable cut computation recording
    if ( pParams->fRecord )
    {
        p->vNodeCuts   = Vec_IntStart( pParams->nIdsMax );
        p->vNodeStarts = Vec_IntStart( pParams->nIdsMax );
        p->vCutPairs   = Vec_IntAlloc( 0 );
    }
    // allocate storage for delays
    if ( pParams->fMap && !p->pParams->fSeq )
    {
        p->vDelays = Vec_IntStart( pParams->nIdsMax );
        p->vDelays2 = Vec_IntStart( pParams->nIdsMax );
        p->vCutsMax = Vec_PtrStart( pParams->nIdsMax );
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    p->vTemp = Vec_PtrAlloc( 100 );
    return p;
}